

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialized_message.h
# Opt level: O1

void __thiscall miniros::SerializedMessage::~SerializedMessage(SerializedMessage *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  p_Var1 = (this->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

class MINIROS_DECL SerializedMessage
{
public:
  using shared_array_uint8_t = std::shared_ptr<uint8_t[]>;
  shared_array_uint8_t buf;
  size_t num_bytes;
  uint8_t* message_start;

  std::shared_ptr<void const> message;
  const std::type_info* type_info;

  SerializedMessage()
  : buf(shared_array_uint8_t())
  , num_bytes(0)
  , message_start(0)
  , type_info(0)
  {}

  SerializedMessage(shared_array_uint8_t buf, size_t num_bytes)
  : buf(buf)
  , num_bytes(num_bytes)
  , message_start(buf ? buf.get() : 0)
  , type_info(0)
  { }
}